

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall
sf::priv::WindowImplX11::setIcon(WindowImplX11 *this,uint width,uint height,Uint8 *pixels)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  WindowImplX11 *pWVar6;
  void *pvVar7;
  Pixmap PVar8;
  Uint8 *pUVar9;
  undefined8 *puVar10;
  Atom AVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Uint8 *pUVar16;
  long lVar17;
  size_t i_1;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar23;
  undefined8 in_stack_fffffffffffffeb0;
  undefined4 uVar24;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar25;
  allocator_type local_129;
  ulong local_128;
  ulong local_120;
  undefined8 local_118;
  long local_110;
  WindowImplX11 *local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> icccmIconPixels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> maskPixels;
  string local_d0;
  XGCValues values;
  
  uVar25 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  uVar23 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  uVar24 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  uVar21 = height * width;
  uVar14 = 0;
  pvVar7 = malloc((ulong)(uVar21 * 4));
  for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
    uVar1 = *(undefined4 *)(pixels + uVar13 * 4);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                         CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1)) >> 0x10),
                         (short)uVar1) & 0xffff00ff00ff00ff;
    auVar22 = pshuflw(auVar22,auVar22,0xc6);
    sVar2 = auVar22._0_2_;
    sVar3 = auVar22._2_2_;
    sVar4 = auVar22._4_2_;
    sVar5 = auVar22._6_2_;
    *(uint *)((long)pvVar7 + uVar13 * 4) =
         CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar22[6] - (0xff < sVar5),
                  CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar22[4] - (0xff < sVar4),
                           CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar22[2] - (0xff < sVar3),
                                    (0 < sVar2) * (sVar2 < 0x100) * auVar22[0] - (0xff < sVar2))));
  }
  lVar17 = *(long *)(this->m_display + 0xe8);
  lVar15 = (long)this->m_screen * 0x80;
  local_110 = XCreateImage(this->m_display,*(undefined8 *)(lVar17 + 0x40 + lVar15),
                           *(undefined4 *)(lVar17 + 0x38 + lVar15),2,0,pvVar7,CONCAT44(uVar23,width)
                           ,CONCAT44(uVar24,height),CONCAT44(uVar25,0x20),
                           uVar14 & 0xffffffff00000000);
  if (local_110 != 0) {
    if (this->m_iconPixmap != 0) {
      XFreePixmap(this->m_display);
    }
    if (this->m_iconMaskPixmap != 0) {
      XFreePixmap(this->m_display);
    }
    PVar8 = XCreatePixmap(this->m_display,
                          *(undefined8 *)
                           (*(long *)(this->m_display + 0xe8) + 0x10 + (long)this->m_screen * 0x80),
                          width,height);
    this->m_iconPixmap = PVar8;
    local_128 = (ulong)width;
    local_120 = (ulong)height;
    local_118 = XCreateGC(this->m_display,PVar8,0,&values);
    lVar17 = local_110;
    uVar14 = local_128;
    XPutImage(this->m_display,this->m_iconPixmap,local_118,local_110,0,0,0,0,local_128,(ulong)height
             );
    local_108 = this;
    XFreeGC(this->m_display,local_118);
    (**(code **)(lVar17 + 0x60))(lVar17);
    uVar13 = (ulong)((int)uVar14 + 7U >> 3);
    uVar20 = local_120 & 0xffffffff;
    local_d0._M_dataplus._M_p = local_d0._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&maskPixels,uVar13 * uVar20,(value_type_conflict5 *)&local_d0,
               (allocator_type *)&icccmIconPixels);
    pWVar6 = local_108;
    uVar14 = uVar14 & 0xffffffff;
    pUVar9 = pixels + 3;
    for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
      lVar17 = 0;
      pUVar16 = pUVar9;
      for (uVar18 = 0; uVar18 != uVar13; uVar18 = uVar18 + 1) {
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          if ((ulong)(lVar17 + lVar15) < uVar14) {
            maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19 * uVar13 + uVar18] =
                 maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar19 * uVar13 + uVar18] |
                 (pUVar16[lVar15 * 4] != '\0') << ((byte)lVar15 & 0x1f);
          }
        }
        lVar17 = lVar17 + 8;
        pUVar16 = pUVar16 + 0x20;
      }
      pUVar9 = pUVar9 + uVar14 * 4;
    }
    PVar8 = XCreatePixmapFromBitmapData
                      (local_108->m_display,local_108->m_window,
                       maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,local_128,local_120,1);
    pWVar6->m_iconMaskPixmap = PVar8;
    puVar10 = (undefined8 *)XAllocWMHints();
    *puVar10 = 0x24;
    puVar10[2] = pWVar6->m_iconPixmap;
    puVar10[5] = pWVar6->m_iconMaskPixmap;
    XSetWMHints(pWVar6->m_display,pWVar6->m_window,puVar10);
    XFree(puVar10);
    local_d0._M_dataplus._M_p = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&icccmIconPixels,(ulong)(uVar21 + 2),(value_type_conflict3 *)&local_d0,&local_129);
    *icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = uVar14;
    icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] = uVar20;
    for (uVar14 = 0; uVar21 != uVar14; uVar14 = uVar14 + 1) {
      icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14 + 2] =
           (long)CONCAT13(pixels[uVar14 * 4 + 3],
                          CONCAT12(pixels[uVar14 * 4],
                                   *(ushort *)(pixels + uVar14 * 4 + 1) << 8 |
                                   *(ushort *)(pixels + uVar14 * 4 + 1) >> 8));
    }
    std::__cxx11::string::string((string *)&local_d0,"_NET_WM_ICON",(allocator *)&local_129);
    AVar11 = getAtom(&local_d0,false);
    std::__cxx11::string::~string((string *)&local_d0);
    XChangeProperty(pWVar6->m_display,pWVar6->m_window,AVar11,6,0x20,0);
    XFlush(pWVar6->m_display);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&icccmIconPixels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&maskPixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  poVar12 = err();
  poVar12 = std::operator<<(poVar12,"Failed to set the window\'s icon");
  std::endl<char,std::char_traits<char>>(poVar12);
  return;
}

Assistant:

void WindowImplX11::setIcon(unsigned int width, unsigned int height, const Uint8* pixels)
{
    // X11 wants BGRA pixels: swap red and blue channels
    // Note: this memory will be freed by XDestroyImage
    Uint8* iconPixels = static_cast<Uint8*>(std::malloc(width * height * 4));
    for (std::size_t i = 0; i < width * height; ++i)
    {
        iconPixels[i * 4 + 0] = pixels[i * 4 + 2];
        iconPixels[i * 4 + 1] = pixels[i * 4 + 1];
        iconPixels[i * 4 + 2] = pixels[i * 4 + 0];
        iconPixels[i * 4 + 3] = pixels[i * 4 + 3];
    }

    // Create the icon pixmap
    Visual*      defVisual = DefaultVisual(m_display, m_screen);
    unsigned int defDepth  = static_cast<unsigned int>(DefaultDepth(m_display, m_screen));
    XImage* iconImage = XCreateImage(m_display, defVisual, defDepth, ZPixmap, 0, reinterpret_cast<char*>(iconPixels), width, height, 32, 0);
    if (!iconImage)
    {
        err() << "Failed to set the window's icon" << std::endl;
        return;
    }

    if (m_iconPixmap)
        XFreePixmap(m_display, m_iconPixmap);

    if (m_iconMaskPixmap)
        XFreePixmap(m_display, m_iconMaskPixmap);

    m_iconPixmap = XCreatePixmap(m_display, RootWindow(m_display, m_screen), width, height, defDepth);
    XGCValues values;
    GC iconGC = XCreateGC(m_display, m_iconPixmap, 0, &values);
    XPutImage(m_display, m_iconPixmap, iconGC, iconImage, 0, 0, 0, 0, width, height);
    XFreeGC(m_display, iconGC);
    XDestroyImage(iconImage);

    // Create the mask pixmap (must have 1 bit depth)
    std::size_t pitch = (width + 7) / 8;
    std::vector<Uint8> maskPixels(pitch * height, 0);
    for (std::size_t j = 0; j < height; ++j)
    {
        for (std::size_t i = 0; i < pitch; ++i)
        {
            for (std::size_t k = 0; k < 8; ++k)
            {
                if (i * 8 + k < width)
                {
                    Uint8 opacity = (pixels[(i * 8 + k + j * width) * 4 + 3] > 0) ? 1 : 0;
                    maskPixels[i + j * pitch] |= static_cast<Uint8>(opacity << k);
                }
            }
        }
    }
    m_iconMaskPixmap = XCreatePixmapFromBitmapData(m_display, m_window, reinterpret_cast<char*>(&maskPixels[0]), width, height, 1, 0, 1);

    // Send our new icon to the window through the WMHints
    XWMHints* hints = XAllocWMHints();
    hints->flags       = IconPixmapHint | IconMaskHint;
    hints->icon_pixmap = m_iconPixmap;
    hints->icon_mask   = m_iconMaskPixmap;
    XSetWMHints(m_display, m_window, hints);
    XFree(hints);

    // ICCCM wants BGRA pixels: swap red and blue channels
    // ICCCM also wants the first 2 unsigned 32-bit values to be width and height
    std::vector<unsigned long> icccmIconPixels(2 + width * height, 0);
    unsigned long* ptr = &icccmIconPixels[0];

    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wnull-dereference" // False positive.
    *ptr++ = width;
    *ptr++ = height;
    #pragma GCC diagnostic pop

    for (std::size_t i = 0; i < width * height; ++i)
    {
        *ptr++ = static_cast<unsigned long>((pixels[i * 4 + 2] << 0 ) |
                                            (pixels[i * 4 + 1] << 8 ) |
                                            (pixels[i * 4 + 0] << 16) |
                                            (pixels[i * 4 + 3] << 24));
    }

    Atom netWmIcon = getAtom("_NET_WM_ICON");

    XChangeProperty(m_display,
                    m_window,
                    netWmIcon,
                    XA_CARDINAL,
                    32,
                    PropModeReplace,
                    reinterpret_cast<const unsigned char*>(&icccmIconPixels[0]),
                    static_cast<int>(2 + width * height));

    XFlush(m_display);
}